

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_3_2_core.cpp
# Opt level: O0

bool __thiscall
QOpenGLFunctions_3_2_Core::initializeOpenGLFunctions(QOpenGLFunctions_3_2_Core *this)

{
  bool bVar1;
  QAbstractOpenGLFunctions *this_00;
  QOpenGLContext *pQVar2;
  QAbstractOpenGLFunctions *pQVar3;
  QOpenGLVersionFunctionsBackend *pQVar4;
  long in_RDI;
  QOpenGLVersionFunctionsBackend *d;
  QOpenGLContext *context;
  undefined4 in_stack_ffffffffffffff78;
  Version in_stack_ffffffffffffff7c;
  QAbstractOpenGLFunctions *in_stack_ffffffffffffff80;
  bool local_1;
  
  bVar1 = QAbstractOpenGLFunctions::isInitialized(in_stack_ffffffffffffff80);
  if (bVar1) {
    local_1 = true;
  }
  else {
    this_00 = (QAbstractOpenGLFunctions *)QOpenGLContext::currentContext();
    pQVar2 = QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff80);
    if ((((pQVar2 != (QOpenGLContext *)0x0) &&
         (pQVar3 = (QAbstractOpenGLFunctions *)
                   QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff80),
         pQVar3 == this_00)) ||
        (pQVar2 = QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff80),
        pQVar2 == (QOpenGLContext *)0x0)) &&
       (bVar1 = isContextCompatible((QOpenGLContext *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
       bVar1)) {
      QOpenGLFunctions_1_0_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x10) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bce9c);
      QOpenGLFunctions_1_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x18) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bcedb);
      QOpenGLFunctions_1_2_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x20) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bcf1a);
      QOpenGLFunctions_1_3_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x28) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bcf59);
      QOpenGLFunctions_1_4_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x30) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bcf98);
      QOpenGLFunctions_1_5_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x38) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bcfd7);
      QOpenGLFunctions_2_0_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x40) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bd016);
      QOpenGLFunctions_2_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x48) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bd055);
      QOpenGLFunctions_3_0_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x50) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bd094);
      QOpenGLFunctions_3_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x58) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bd0d3);
      QOpenGLFunctions_3_2_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)this_00,in_stack_ffffffffffffff7c);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x60) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bd112);
      QAbstractOpenGLFunctions::initializeOpenGLFunctions(this_00);
      in_stack_ffffffffffffff80 = this_00;
    }
    local_1 = QAbstractOpenGLFunctions::isInitialized(in_stack_ffffffffffffff80);
  }
  return local_1;
}

Assistant:

bool QOpenGLFunctions_3_2_Core::initializeOpenGLFunctions()
{
    if ( isInitialized() )
        return true;

    QOpenGLContext* context = QOpenGLContext::currentContext();

    // If owned by a context object make sure it is current.
    // Also check that current context is capable of resolving all needed functions
    if (((owningContext() && owningContext() == context) || !owningContext())
        && QOpenGLFunctions_3_2_Core::isContextCompatible(context))
    {
        // Associate with private implementation, creating if necessary
        // Function pointers in the backends are resolved at creation time
        QOpenGLVersionFunctionsBackend* d = nullptr;
        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_CoreBackend::versionStatus());
        d_1_0_Core = static_cast<QOpenGLFunctions_1_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_CoreBackend::versionStatus());
        d_1_1_Core = static_cast<QOpenGLFunctions_1_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_CoreBackend::versionStatus());
        d_1_2_Core = static_cast<QOpenGLFunctions_1_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_CoreBackend::versionStatus());
        d_1_3_Core = static_cast<QOpenGLFunctions_1_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_CoreBackend::versionStatus());
        d_1_4_Core = static_cast<QOpenGLFunctions_1_4_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_5_CoreBackend::versionStatus());
        d_1_5_Core = static_cast<QOpenGLFunctions_1_5_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_2_0_CoreBackend::versionStatus());
        d_2_0_Core = static_cast<QOpenGLFunctions_2_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_2_1_CoreBackend::versionStatus());
        d_2_1_Core = static_cast<QOpenGLFunctions_2_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_0_CoreBackend::versionStatus());
        d_3_0_Core = static_cast<QOpenGLFunctions_3_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_1_CoreBackend::versionStatus());
        d_3_1_Core = static_cast<QOpenGLFunctions_3_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_2_CoreBackend::versionStatus());
        d_3_2_Core = static_cast<QOpenGLFunctions_3_2_CoreBackend*>(d);
        d->refs.ref();

        QAbstractOpenGLFunctions::initializeOpenGLFunctions();
    }
    return isInitialized();
}